

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double.cc
# Opt level: O2

bool __thiscall MultForm::findResLo(MultForm *this)

{
  Varnode *pVVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  Varnode *pVVar4;
  Varnode *pVVar5;
  Varnode *pVVar6;
  _List_node_base *p_Var7;
  
  pVVar1 = this->lo1;
  p_Var7 = (this->midtmp->descend).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  while (p_Var7 != (_List_node_base *)&this->midtmp->descend) {
    p_Var2 = p_Var7->_M_next;
    p_Var3 = p_Var7[1]._M_next;
    p_Var7 = p_Var2;
    if (((*(int *)((long)p_Var3->_M_next + 0x10) == 0x3f) &&
        (*(long *)(*(long *)((long)p_Var3[5]._M_next + 8) + 0x18) == 0)) &&
       (pVVar4 = *(Varnode **)((long)(p_Var3 + 4) + 8), this->reslo = pVVar4,
       pVVar4->size == pVVar1->size)) {
      return true;
    }
  }
  pVVar4 = this->lo2;
  p_Var7 = (pVVar1->descend).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node
           .super__List_node_base._M_next;
  do {
    while( true ) {
      do {
        if (p_Var7 == (_List_node_base *)&pVVar1->descend) {
          return false;
        }
        p_Var2 = p_Var7->_M_next;
        p_Var3 = p_Var7[1]._M_next;
        p_Var7 = p_Var2;
      } while (*(int *)((long)p_Var3->_M_next + 0x10) != 0x20);
      pVVar5 = *(Varnode **)p_Var3[5]._M_next;
      pVVar6 = *(Varnode **)((long)p_Var3[5]._M_next + 8);
      if ((pVVar4->flags & 2) != 0) break;
      if ((pVVar5 == pVVar4) || (pVVar6 == pVVar4)) goto LAB_00309e4e;
    }
  } while ((((pVVar5->flags & 2) == 0) || ((pVVar5->loc).offset != (pVVar4->loc).offset)) &&
          (((pVVar6->flags & 2) == 0 || ((pVVar6->loc).offset != (pVVar4->loc).offset))));
LAB_00309e4e:
  this->reslo = *(Varnode **)((long)(p_Var3 + 4) + 8);
  return true;
}

Assistant:

bool MultForm::findResLo(void)

{ // Assuming we found -midtmp-, find potential reslo
  list<PcodeOp *>::const_iterator iter,enditer;
  iter = midtmp->beginDescend();
  enditer = midtmp->endDescend();
  while(iter != enditer) {
    PcodeOp *op = *iter;
    ++iter;
    if (op->code() != CPUI_SUBPIECE) continue;
    if (op->getIn(1)->getOffset() != 0) continue; // Must grab low bytes
    reslo = op->getOut();
    if (reslo->getSize() != lo1->getSize()) continue;
    return true;
  }
  // If we reach here, it may be that separate multiplies of lo1*lo2 were used for reshi and reslo
  iter = lo1->beginDescend();
  enditer = lo1->endDescend();
  while(iter != enditer) {
    PcodeOp *op = *iter;
    ++iter;
    if (op->code() != CPUI_INT_MULT) continue;
    Varnode *vn1 = op->getIn(0);
    Varnode *vn2 = op->getIn(1);
    if (lo2->isConstant()) {
      if ((!vn1->isConstant() || (vn1->getOffset() != lo2->getOffset())) &&
	  (!vn2->isConstant() || (vn2->getOffset() != lo2->getOffset())))
	continue;
    }
    else 
      if ((op->getIn(0)!=lo2)&&(op->getIn(1)!=lo2)) continue;
    reslo = op->getOut();
    return true;
  }
  return false;
}